

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O0

void __thiscall OSTEIDeriv1_Writer::WriteAccumulation(OSTEIDeriv1_Writer *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  QAM *am;
  long in_RDI;
  QAM *it_2;
  iterator __end1_2;
  iterator __begin1_2;
  QAMSet *__range1_2;
  int ncart_1;
  QAM *it_1;
  iterator __end1_1;
  iterator __begin1_1;
  QAMSet *__range1_1;
  int ncart;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMSet *__range1;
  QAMSet topq;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffffba8;
  QAM *in_stack_fffffffffffffbb0;
  QAM *in_stack_fffffffffffffbc8;
  QAM *in_stack_fffffffffffffbd0;
  QAM *in_stack_fffffffffffffbf8;
  string local_298 [32];
  reference local_278;
  _Self local_270;
  _Self local_268;
  undefined1 *local_260;
  string local_258 [32];
  string local_238 [32];
  string local_218 [80];
  string local_1c8 [84];
  int local_174;
  reference local_170;
  _Self local_168;
  _Self local_160;
  undefined1 *local_158;
  string local_150 [32];
  string local_130 [32];
  string local_110 [80];
  string local_c0 [84];
  int local_6c;
  reference local_68;
  _Self local_60;
  _Self local_58;
  undefined1 *local_50;
  undefined1 local_38 [56];
  
  OSTEI_HRR_Writer::Algo(*(OSTEI_HRR_Writer **)(in_RDI + 0x28));
  OSTEI_HRR_Algorithm_Base::TopAM(in_stack_fffffffffffffba8);
  std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"////////////////////////////////////\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"// Accumulate contracted integrals\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"////////////////////////////////////\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"if(lastoffset == 0)\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"{\n");
  local_50 = local_38;
  local_58._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffba8);
  local_60._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffba8);
  while( true ) {
    bVar1 = std::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    local_68 = std::_Rb_tree_const_iterator<QAM>::operator*
                         ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffbb0);
    QAM::QAM(in_stack_fffffffffffffbb0,(QAM *)in_stack_fffffffffffffba8);
    iVar2 = NCART(in_stack_fffffffffffffbd0);
    QAM::~QAM((QAM *)0x15ead1);
    local_6c = iVar2;
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 0) {
      poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent6_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"contract_all    (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_6c);
      poVar3 = std::operator<<(poVar3,", ");
      PrimVarName_abi_cxx11_(in_stack_fffffffffffffbf8);
      poVar3 = std::operator<<(poVar3,local_130);
      poVar3 = std::operator<<(poVar3,", ");
      PrimPtrName_abi_cxx11_(in_stack_fffffffffffffbf8);
      poVar3 = std::operator<<(poVar3,local_150);
      std::operator<<(poVar3,");\n");
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_130);
    }
    else {
      poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent6_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"contract_all_fac(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_6c);
      poVar3 = std::operator<<(poVar3,", cfac_");
      poVar3 = std::operator<<(poVar3,(string *)&local_68->tag);
      poVar3 = std::operator<<(poVar3,", ");
      QAM::notag(in_stack_fffffffffffffbc8);
      PrimVarName_abi_cxx11_(in_stack_fffffffffffffbf8);
      poVar3 = std::operator<<(poVar3,local_c0);
      poVar3 = std::operator<<(poVar3,", ");
      PrimPtrName_abi_cxx11_(in_stack_fffffffffffffbf8);
      poVar3 = std::operator<<(poVar3,local_110);
      std::operator<<(poVar3,");\n");
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_c0);
      QAM::~QAM((QAM *)0x15ec95);
    }
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffbb0);
  }
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"}\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"else\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"{\n");
  local_158 = local_38;
  local_160._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffba8);
  local_168._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffba8);
  while( true ) {
    bVar1 = std::operator!=(&local_160,&local_168);
    if (!bVar1) break;
    local_170 = std::_Rb_tree_const_iterator<QAM>::operator*
                          ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffbb0);
    QAM::QAM(in_stack_fffffffffffffbb0,(QAM *)in_stack_fffffffffffffba8);
    iVar2 = NCART(in_stack_fffffffffffffbd0);
    QAM::~QAM((QAM *)0x15f029);
    local_174 = iVar2;
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 0) {
      poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent6_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"contract    (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_174);
      in_stack_fffffffffffffbf8 = (QAM *)std::operator<<(poVar3,", shelloffsets, ");
      PrimVarName_abi_cxx11_(in_stack_fffffffffffffbf8);
      poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffbf8,local_238);
      poVar3 = std::operator<<(poVar3,", ");
      PrimPtrName_abi_cxx11_(in_stack_fffffffffffffbf8);
      poVar3 = std::operator<<(poVar3,local_258);
      std::operator<<(poVar3,");\n");
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_238);
    }
    else {
      poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent6_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"contract_fac(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_174);
      poVar3 = std::operator<<(poVar3,", cfac_");
      poVar3 = std::operator<<(poVar3,(string *)&local_170->tag);
      poVar3 = std::operator<<(poVar3,", shelloffsets, ");
      QAM::notag(in_stack_fffffffffffffbc8);
      PrimVarName_abi_cxx11_(in_stack_fffffffffffffbf8);
      poVar3 = std::operator<<(poVar3,local_1c8);
      poVar3 = std::operator<<(poVar3,", ");
      PrimPtrName_abi_cxx11_(in_stack_fffffffffffffbf8);
      poVar3 = std::operator<<(poVar3,local_218);
      std::operator<<(poVar3,");\n");
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_1c8);
      QAM::~QAM((QAM *)0x15f1e1);
    }
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffbb0);
  }
  local_260 = local_38;
  local_268._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffba8);
  local_270._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffba8);
  while( true ) {
    bVar1 = std::operator!=(&local_268,&local_270);
    if (!bVar1) break;
    local_278 = std::_Rb_tree_const_iterator<QAM>::operator*
                          ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffbb0);
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent6_abi_cxx11_);
    PrimPtrName_abi_cxx11_(in_stack_fffffffffffffbf8);
    am = (QAM *)std::operator<<(poVar3,local_298);
    poVar3 = std::operator<<((ostream *)am," += lastoffset*");
    QAM::QAM(in_stack_fffffffffffffbb0,(QAM *)in_stack_fffffffffffffba8);
    iVar2 = NCART(am);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,";\n");
    QAM::~QAM((QAM *)0x15f519);
    std::__cxx11::string::~string(local_298);
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffbb0);
  }
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar3,"}\n");
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x15f5bd);
  return;
}

Assistant:

void OSTEIDeriv1_Writer::WriteAccumulation(void) const
{
    const auto topq = hrr_writer_.Algo().TopAM();

    os_ << "\n\n";
    os_ << indent5 << "////////////////////////////////////\n";
    os_ << indent5 << "// Accumulate contracted integrals\n";
    os_ << indent5 << "////////////////////////////////////\n";

    os_ << indent5 << "if(lastoffset == 0)\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        if(it.tag.size())
            os_ << indent6 << "contract_all_fac(" << ncart << ", cfac_" << it.tag << ", "
                           << PrimVarName(it.notag()) << ", " << PrimPtrName(it) << ");\n";
        else
            os_ << indent6 << "contract_all    (" << ncart << ", " << PrimVarName(it)
                           << ", " << PrimPtrName(it) << ");\n";
    }
    os_ << indent5 << "}\n";
    os_ << indent5 << "else\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        if(it.tag.size())
            os_ << indent6 << "contract_fac(" << ncart << ", cfac_" << it.tag << ", shelloffsets, "
                           << PrimVarName(it.notag()) << ", " << PrimPtrName(it) << ");\n";
        else
            os_ << indent6 << "contract    (" << ncart << ", shelloffsets, " << PrimVarName(it)
                           << ", " << PrimPtrName(it) << ");\n";
    }

    for(const auto &it : topq)
        os_ << indent6 << PrimPtrName(it) << " += lastoffset*" << NCART(it) << ";\n";

    os_ << indent5 << "}\n";
}